

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3ConstructBloomFilter(WhereInfo *pWInfo,int iLevel,WhereLevel *pLevel,Bitmask notReady)

{
  ushort uVar1;
  Parse *pParse_00;
  long lVar2;
  int iVar3;
  int iVar4;
  ulong in_RCX;
  undefined8 *in_RDX;
  int in_ESI;
  undefined8 *in_RDI;
  SrcItem *pTabItem;
  int jj;
  int r1_1;
  int n;
  Index *pIdx;
  int r1;
  Expr *pExpr;
  int iSrc;
  u64 sz;
  Table *pTab;
  SrcItem *pItem;
  SrcList *pTabList;
  IndexedExpr *saved_pIdxPartExpr;
  IndexedExpr *saved_pIdxEpr;
  int iCur;
  WhereLoop *pLoop;
  Vdbe *v;
  Parse *pParse;
  WhereTerm *pWCEnd;
  WhereTerm *pTerm;
  int addrCont;
  int addrTop;
  int addrOnce;
  long in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  int in_stack_ffffffffffffff48;
  uint in_stack_ffffffffffffff4c;
  Parse *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  anon_union_8_2_443a03b8_for_u *paVar5;
  Expr *pExpr_00;
  Parse *pParse_01;
  WhereLevel *pLevel_00;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 uVar6;
  Parse *pParse_02;
  ulong local_38;
  undefined8 *local_18;
  int local_c;
  
  pParse_00 = (Parse *)*in_RDI;
  pParse_02 = (Parse *)in_RDX[0xc];
  uVar6 = 0xaaaaaaaa;
  pLevel_00 = (WhereLevel *)pParse_00->pIdxEpr;
  pParse_01 = (Parse *)pParse_00->pIdxPartExpr;
  pParse_00->pIdxEpr = (IndexedExpr *)0x0;
  pParse_00->pIdxPartExpr = (IndexedExpr *)0x0;
  sqlite3VdbeAddOp0((Vdbe *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                    (int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
  local_18 = in_RDX;
  local_c = in_ESI;
  do {
    sqlite3WhereExplainBloomFilter
              (pParse_02,(WhereInfo *)CONCAT44(uVar6,in_stack_ffffffffffffffa0),pLevel_00);
    sqlite3VdbeMakeLabel(pParse_00);
    uVar6 = *(undefined4 *)((long)local_18 + 4);
    iVar4 = pParse_00->nMem + 1;
    pParse_00->nMem = iVar4;
    *(int *)((long)local_18 + 0x34) = iVar4;
    pExpr_00 = (Expr *)in_RDI[1];
    paVar5 = &pExpr_00[(int)(uint)*(byte *)(local_18 + 8)].u;
    sqlite3LogEstToInt(*(LogEst *)((long)&((Expr *)paVar5[2].zToken)->pAggInfo + 2));
    sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                      (int)((ulong)in_stack_ffffffffffffff38 >> 0x20),(int)in_stack_ffffffffffffff38
                      ,0);
    sqlite3VdbeAddOp1((Vdbe *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                      (int)((ulong)in_stack_ffffffffffffff38 >> 0x20),(int)in_stack_ffffffffffffff38
                     );
    lVar2 = in_RDI[0x11];
    iVar4 = *(int *)((long)in_RDI + 0x7c);
    for (local_38 = in_RDI[0x11]; local_38 < (ulong)(lVar2 + (long)iVar4 * 0x38);
        local_38 = local_38 + 0x38) {
      if (((*(ushort *)(local_38 + 0x12) & 2) == 0) &&
         (iVar3 = sqlite3ExprIsSingleTableConstraint
                            ((Expr *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                             (SrcList *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                             in_stack_ffffffffffffff48), iVar3 != 0)) {
        sqlite3ExprIfFalse(pParse_01,pExpr_00,(int)((ulong)paVar5 >> 0x20),(int)paVar5);
      }
    }
    if ((pParse_02->iRangeReg & 0x100U) == 0) {
      in_stack_ffffffffffffff50 = *(Parse **)&pParse_02->isMultiWrite;
      uVar1 = (ushort)pParse_02->rc;
      in_stack_ffffffffffffff4c = (uint)uVar1;
      in_stack_ffffffffffffff48 =
           sqlite3GetTempRange((Parse *)(ulong)CONCAT24(uVar1,in_stack_ffffffffffffff48),
                               in_stack_ffffffffffffff44);
      for (in_stack_ffffffffffffff44 = 0; in_stack_ffffffffffffff44 < (int)in_stack_ffffffffffffff4c
          ; in_stack_ffffffffffffff44 = in_stack_ffffffffffffff44 + 1) {
        sqlite3ExprCodeLoadIndexColumn
                  (in_stack_ffffffffffffff50,
                   (Index *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                   in_stack_ffffffffffffff44,in_stack_ffffffffffffff40,
                   (int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
      }
      sqlite3VdbeAddOp4Int
                ((Vdbe *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                 (int)((ulong)in_stack_ffffffffffffff50 >> 0x20),(int)in_stack_ffffffffffffff50,
                 in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48,in_stack_ffffffffffffff44);
      sqlite3ReleaseTempRange
                ((Parse *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 (int)((ulong)in_stack_ffffffffffffff38 >> 0x20),(int)in_stack_ffffffffffffff38);
    }
    else {
      in_stack_ffffffffffffff5c = sqlite3GetTempReg(pParse_00);
      sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                        (int)((ulong)in_stack_ffffffffffffff38 >> 0x20),
                        (int)in_stack_ffffffffffffff38,0);
      sqlite3VdbeAddOp4Int
                ((Vdbe *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                 (int)((ulong)in_stack_ffffffffffffff50 >> 0x20),(int)in_stack_ffffffffffffff50,
                 in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48,in_stack_ffffffffffffff44);
      sqlite3ReleaseTempReg(pParse_00,in_stack_ffffffffffffff5c);
    }
    sqlite3VdbeResolveLabel((Vdbe *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
    sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                      (int)((ulong)in_stack_ffffffffffffff38 >> 0x20),(int)in_stack_ffffffffffffff38
                      ,0);
    sqlite3VdbeJumpHere((Vdbe *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                        (int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
    pParse_02->iRangeReg = pParse_02->iRangeReg & 0xffbfffff;
    if ((pParse_00->db->dbOptFlags & 0x100000) != 0) break;
    do {
      local_c = local_c + 1;
      if ((int)(uint)*(byte *)(in_RDI + 8) <= local_c) break;
      local_18 = in_RDI + (long)local_c * 0xe + 0x6b;
      in_stack_ffffffffffffff38 = in_RDI[1] + 8 + (ulong)*(byte *)(local_18 + 8) * 0x48;
    } while (((((*(byte *)(in_stack_ffffffffffffff38 + 0x18) & 0x48) != 0) ||
              (pParse_02 = (Parse *)local_18[0xc], pParse_02 == (Parse *)0x0)) ||
             (((ulong)pParse_02->db & in_RCX) != 0)) ||
            ((pParse_02->iRangeReg & 0x400004U) != 0x400000));
  } while (local_c < (int)(uint)*(byte *)(in_RDI + 8));
  sqlite3VdbeJumpHere((Vdbe *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                      (int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
  pParse_00->pIdxEpr = (IndexedExpr *)pLevel_00;
  pParse_00->pIdxPartExpr = (IndexedExpr *)pParse_01;
  return;
}

Assistant:

static SQLITE_NOINLINE void sqlite3ConstructBloomFilter(
  WhereInfo *pWInfo,    /* The WHERE clause */
  int iLevel,           /* Index in pWInfo->a[] that is pLevel */
  WhereLevel *pLevel,   /* Make a Bloom filter for this FROM term */
  Bitmask notReady      /* Loops that are not ready */
){
  int addrOnce;                        /* Address of opening OP_Once */
  int addrTop;                         /* Address of OP_Rewind */
  int addrCont;                        /* Jump here to skip a row */
  const WhereTerm *pTerm;              /* For looping over WHERE clause terms */
  const WhereTerm *pWCEnd;             /* Last WHERE clause term */
  Parse *pParse = pWInfo->pParse;      /* Parsing context */
  Vdbe *v = pParse->pVdbe;             /* VDBE under construction */
  WhereLoop *pLoop = pLevel->pWLoop;   /* The loop being coded */
  int iCur;                            /* Cursor for table getting the filter */
  IndexedExpr *saved_pIdxEpr;          /* saved copy of Parse.pIdxEpr */
  IndexedExpr *saved_pIdxPartExpr;     /* saved copy of Parse.pIdxPartExpr */

  saved_pIdxEpr = pParse->pIdxEpr;
  saved_pIdxPartExpr = pParse->pIdxPartExpr;
  pParse->pIdxEpr = 0;
  pParse->pIdxPartExpr = 0;

  assert( pLoop!=0 );
  assert( v!=0 );
  assert( pLoop->wsFlags & WHERE_BLOOMFILTER );
  assert( (pLoop->wsFlags & WHERE_IDX_ONLY)==0 );

  addrOnce = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);
  do{
    const SrcList *pTabList;
    const SrcItem *pItem;
    const Table *pTab;
    u64 sz;
    int iSrc;
    sqlite3WhereExplainBloomFilter(pParse, pWInfo, pLevel);
    addrCont = sqlite3VdbeMakeLabel(pParse);
    iCur = pLevel->iTabCur;
    pLevel->regFilter = ++pParse->nMem;

    /* The Bloom filter is a Blob held in a register.  Initialize it
    ** to zero-filled blob of at least 80K bits, but maybe more if the
    ** estimated size of the table is larger.  We could actually
    ** measure the size of the table at run-time using OP_Count with
    ** P3==1 and use that value to initialize the blob.  But that makes
    ** testing complicated.  By basing the blob size on the value in the
    ** sqlite_stat1 table, testing is much easier.
    */
    pTabList = pWInfo->pTabList;
    iSrc = pLevel->iFrom;
    pItem = &pTabList->a[iSrc];
    assert( pItem!=0 );
    pTab = pItem->pSTab;
    assert( pTab!=0 );
    sz = sqlite3LogEstToInt(pTab->nRowLogEst);
    if( sz<10000 ){
      sz = 10000;
    }else if( sz>10000000 ){
      sz = 10000000;
    }
    sqlite3VdbeAddOp2(v, OP_Blob, (int)sz, pLevel->regFilter);

    addrTop = sqlite3VdbeAddOp1(v, OP_Rewind, iCur); VdbeCoverage(v);
    pWCEnd = &pWInfo->sWC.a[pWInfo->sWC.nTerm];
    for(pTerm=pWInfo->sWC.a; pTerm<pWCEnd; pTerm++){
      Expr *pExpr = pTerm->pExpr;
      if( (pTerm->wtFlags & TERM_VIRTUAL)==0
       && sqlite3ExprIsSingleTableConstraint(pExpr, pTabList, iSrc, 0)
      ){
        sqlite3ExprIfFalse(pParse, pTerm->pExpr, addrCont, SQLITE_JUMPIFNULL);
      }
    }
    if( pLoop->wsFlags & WHERE_IPK ){
      int r1 = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp2(v, OP_Rowid, iCur, r1);
      sqlite3VdbeAddOp4Int(v, OP_FilterAdd, pLevel->regFilter, 0, r1, 1);
      sqlite3ReleaseTempReg(pParse, r1);
    }else{
      Index *pIdx = pLoop->u.btree.pIndex;
      int n = pLoop->u.btree.nEq;
      int r1 = sqlite3GetTempRange(pParse, n);
      int jj;
      for(jj=0; jj<n; jj++){
        assert( pIdx->pTable==pItem->pSTab );
        sqlite3ExprCodeLoadIndexColumn(pParse, pIdx, iCur, jj, r1+jj);
      }
      sqlite3VdbeAddOp4Int(v, OP_FilterAdd, pLevel->regFilter, 0, r1, n);
      sqlite3ReleaseTempRange(pParse, r1, n);
    }
    sqlite3VdbeResolveLabel(v, addrCont);
    sqlite3VdbeAddOp2(v, OP_Next, pLevel->iTabCur, addrTop+1);
    VdbeCoverage(v);
    sqlite3VdbeJumpHere(v, addrTop);
    pLoop->wsFlags &= ~WHERE_BLOOMFILTER;
    if( OptimizationDisabled(pParse->db, SQLITE_BloomPulldown) ) break;
    while( ++iLevel < pWInfo->nLevel ){
      const SrcItem *pTabItem;
      pLevel = &pWInfo->a[iLevel];
      pTabItem = &pWInfo->pTabList->a[pLevel->iFrom];
      if( pTabItem->fg.jointype & (JT_LEFT|JT_LTORJ) ) continue;
      pLoop = pLevel->pWLoop;
      if( NEVER(pLoop==0) ) continue;
      if( pLoop->prereq & notReady ) continue;
      if( (pLoop->wsFlags & (WHERE_BLOOMFILTER|WHERE_COLUMN_IN))
                 ==WHERE_BLOOMFILTER
      ){
        /* This is a candidate for bloom-filter pull-down (early evaluation).
        ** The test that WHERE_COLUMN_IN is omitted is important, as we are
        ** not able to do early evaluation of bloom filters that make use of
        ** the IN operator */
        break;
      }
    }
  }while( iLevel < pWInfo->nLevel );
  sqlite3VdbeJumpHere(v, addrOnce);
  pParse->pIdxEpr = saved_pIdxEpr;
  pParse->pIdxPartExpr = saved_pIdxPartExpr;
}